

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O3

int32_t lj_lib_checkint(lua_State *L,int narg)

{
  uint uVar1;
  int iVar2;
  TValue *o;
  
  o = L->base + (long)narg + -1;
  if (o < L->top) {
    uVar1 = *(uint *)((long)L->base + (long)narg * 8 + -4);
    if (uVar1 < 0xffff0000) {
LAB_0011671a:
      return (int)o->n;
    }
    if (uVar1 == 0xfffffffb) {
      iVar2 = lj_strscan_num((GCstr *)(ulong)(o->u32).lo,o);
      if (iVar2 != 0) goto LAB_0011671a;
    }
  }
  lj_err_argt(L,narg,3);
}

Assistant:

int32_t lj_lib_checkint(lua_State *L, int narg)
{
  TValue *o = L->base + narg-1;
  if (!(o < L->top && lj_strscan_numberobj(o)))
    lj_err_argt(L, narg, LUA_TNUMBER);
  if (LJ_LIKELY(tvisint(o))) {
    return intV(o);
  } else {
    int32_t i = lj_num2int(numV(o));
    if (LJ_DUALNUM) setintV(o, i);
    return i;
  }
}